

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::
strTree<kj::StringTree,char_const(&)[18],kj::String&,char_const(&)[51],kj::String&,char_const(&)[12]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char (*params_1) [18],
          String *params_2,char (*params_3) [51],String *params_4,char (*params_5) [12])

{
  char *pcVar1;
  Branch *pBVar2;
  ArrayPtr<const_char> local_70;
  StringTree *local_60;
  char *local_58;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_58 = (char *)strlen((char *)params);
  pcVar1 = *(char **)(*params_1 + 8);
  local_70.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_70.ptr = *(char **)*params_1;
  }
  local_70.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_70.size_ = (size_t)(char *)0x0;
  }
  local_60 = params;
  strlen((char *)params_2);
  pBVar2 = *(Branch **)(*params_3 + 8);
  local_40.ptr = (char *)pBVar2;
  if (pBVar2 != (Branch *)0x0) {
    local_40.ptr = *(char **)*params_3;
  }
  local_40.size_ = (size_t)((long)&pBVar2[-1].content.branches.disposer + 7);
  if (pBVar2 == (Branch *)0x0) {
    local_40.size_ = (size_t)(char *)0x0;
  }
  local_50.size_ = strlen((char *)params_4);
  local_50.ptr = (char *)params_4;
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)this,(StringTree *)&local_60,&local_70,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff80,&local_40,&local_50,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}